

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void * nk_draw_vertex(void *dst,nk_convert_config *config,nk_vec2 pos,nk_vec2 uv,nk_colorf color)

{
  nk_anti_aliasing value_count;
  float fVar1;
  nk_color nVar2;
  uint uVar3;
  ulong in_RCX;
  long in_RDX;
  nk_size length;
  void *dst0;
  undefined8 *src0;
  nk_vec2 *values;
  nk_vec2 *pnVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar9;
  undefined1 auVar8 [16];
  uint uVar10;
  nk_uint col [3];
  undefined8 local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  uint local_118;
  uint local_114;
  uint local_110;
  int local_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  long local_c0;
  nk_vec2 local_b8;
  nk_vec2 local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  fVar1 = config->global_alpha;
  local_c0 = in_RDX;
  if (fVar1 != 4.2039e-45) {
    fVar7 = color.r;
    fVar9 = color.g;
    fStack_d0 = color.r;
    fStack_cc = color.g;
    uVar3 = -(uint)(fVar7 <= 0.0 || 1.0 < fVar7);
    uVar10 = -(uint)(fVar9 <= 0.0 || 1.0 < fVar9);
    fStack_d0 = (float)(~-(uint)(fStack_d0 <= 0.0 || 0.0 < fStack_d0) & (uint)fStack_d0);
    fStack_cc = (float)(~-(uint)(fStack_cc <= 0.0 || 0.0 < fStack_cc) & (uint)fStack_cc);
    local_d8 = (float)(~uVar3 & (uint)fVar7 |
                      -(uint)(0.0 < fVar7 || 1.0 < fVar7) & 0x3f800000 & uVar3);
    local_108 = (float)(~uVar10 & (uint)fVar9 |
                       -(uint)(0.0 < fVar9 || 1.0 < fVar9) & 0x3f800000 & uVar10);
    local_68 = (double)local_d8;
    dStack_60 = (double)local_108;
    auVar8._0_4_ = (int)(local_d8 * 65535.0);
    auVar8._4_4_ = (int)(local_108 * 65535.0);
    auVar8._8_4_ = (int)(fStack_d0 * 0.0);
    auVar8._12_4_ = (int)(fStack_cc * 0.0);
    local_a8 = pshuflw(auVar8,auVar8,0xe8);
    fVar7 = color.b;
    fVar9 = color.a;
    fStack_e0 = color.b;
    fStack_dc = color.a;
    uVar3 = -(uint)(fVar7 <= 0.0 || 1.0 < fVar7);
    uVar10 = -(uint)(fVar9 <= 0.0 || 1.0 < fVar9);
    fStack_e0 = (float)(~-(uint)(fStack_e0 <= 0.0 || 0.0 < fStack_e0) & (uint)fStack_e0);
    fStack_dc = (float)(~-(uint)(fStack_dc <= 0.0 || 0.0 < fStack_dc) & (uint)fStack_dc);
    local_e8 = (float)(~uVar3 & (uint)fVar7 |
                      -(uint)(0.0 < fVar7 || 1.0 < fVar7) & 0x3f800000 & uVar3);
    local_f8 = (float)(~uVar10 & (uint)fVar9 |
                      -(uint)(0.0 < fVar9 || 1.0 < fVar9) & 0x3f800000 & uVar10);
    local_78 = (double)local_e8;
    dStack_70 = (double)local_f8;
    local_110 = (uint)(local_d8 * 4.2949673e+09);
    local_114 = (uint)(local_108 * 4.2949673e+09);
    local_118 = (uint)(local_e8 * 4.2949673e+09);
    uStack_7c = (uint)(local_f8 * 4.2949673e+09);
    local_110 = (int)(local_d8 * 4.2949673e+09 - 2.1474836e+09) & (int)local_110 >> 0x1f | local_110
    ;
    local_114 = (int)(local_108 * 4.2949673e+09 - 2.1474836e+09) & (int)local_114 >> 0x1f |
                local_114;
    local_118 = (int)(local_e8 * 4.2949673e+09 - 2.1474836e+09) & (int)local_118 >> 0x1f | local_118
    ;
    uStack_7c = (int)(local_f8 * 4.2949673e+09 - 2.1474836e+09) & (int)uStack_7c >> 0x1f | uStack_7c
    ;
    auVar6._0_4_ = local_e8 * 65535.0;
    auVar6._4_4_ = local_f8 * 65535.0;
    auVar6._8_4_ = fStack_e0 * 0.0;
    auVar6._12_4_ = fStack_dc * 0.0;
    auVar5._0_4_ = (int)auVar6._0_4_;
    auVar5._4_4_ = (int)auVar6._4_4_;
    auVar5._8_4_ = (int)auVar6._8_4_;
    auVar5._12_4_ = (int)auVar6._12_4_;
    local_98 = pshuflw(auVar6,auVar5,0xe8);
    pnVar4 = (nk_vec2 *)&config->arc_segment_count;
    local_10c = auVar5._0_4_;
    fStack_104 = local_108;
    fStack_100 = local_108;
    fStack_fc = local_108;
    fStack_f4 = local_f8;
    fStack_f0 = local_f8;
    fStack_ec = local_f8;
    fStack_e4 = local_f8;
    fStack_d4 = local_108;
    local_b8 = uv;
    local_b0 = pos;
    local_88 = local_110;
    uStack_84 = local_114;
    uStack_80 = local_118;
    local_58 = local_d8;
    fStack_54 = local_108;
    fStack_50 = local_e8;
    fStack_4c = local_f8;
    do {
      value_count = ((nk_convert_config *)(pnVar4 + -2))->line_AA;
      if (value_count == 0x13) break;
      dst0 = (void *)((long)(((nk_draw_null_texture *)(pnVar4 + -1))->texture).ptr + (long)dst);
      values = &local_b0;
      if (fVar1 == 0.0) {
LAB_001227d0:
        nk_draw_vertex_element(dst0,&values->x,value_count,(nk_draw_vertex_layout_format)in_RCX);
        goto LAB_001227d5;
      }
      if (fVar1 != 1.4013e-45) {
        values = &local_b8;
        if (fVar1 != 2.8026e-45) {
          __assert_fail("0 && \"wrong element attribute\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                        ,0x2537,
                        "void *nk_draw_vertex(void *, const struct nk_convert_config *, struct nk_vec2, struct nk_vec2, struct nk_colorf)"
                       );
        }
        goto LAB_001227d0;
      }
      if (value_count < 8) {
        __assert_fail("format >= NK_FORMAT_COLOR_BEGIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x24b2,
                      "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                     );
      }
      if (0x12 < value_count) {
        __assert_fail("format <= NK_FORMAT_COLOR_END",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x24b3,
                      "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                     );
      }
      local_48 = CONCAT44(fStack_54,local_58);
      uStack_40 = CONCAT44(fStack_4c,fStack_50);
      switch(value_count) {
      default:
        nVar2 = nk_rgba_f(local_d8,local_108,local_e8,local_f8);
        goto LAB_001227b5;
      case 9:
        local_138._0_6_ = CONCAT24((short)local_10c,local_a8._0_4_);
        length = 6;
        src0 = &local_138;
        break;
      case 10:
        local_138 = (double)CONCAT44(local_114,local_110);
        dStack_130 = (double)CONCAT44(dStack_130._4_4_,local_118);
        length = 0xc;
        src0 = &local_138;
        break;
      case 0xc:
        nVar2 = nk_rgba_f(local_d8,local_108,local_e8,local_f8);
        uVar3 = (uint)nVar2 >> 0x10 & 0xff;
        in_RCX = (ulong)uVar3;
        nVar2 = (nk_color)((uint)nVar2 & 0xff00ff00 | ((uint)nVar2 & 0xff) << 0x10 | uVar3);
LAB_001227b5:
        local_138 = (double)CONCAT44(local_138._4_4_,nVar2);
        length = 4;
        src0 = &local_138;
        break;
      case 0xd:
        local_138 = (double)CONCAT44(local_98._0_4_,local_a8._0_4_);
        length = 8;
        src0 = &local_138;
        break;
      case 0xe:
        local_138 = (double)CONCAT44(uStack_84,local_88);
        dStack_130 = (double)CONCAT44(uStack_7c,uStack_80);
        length = 0x10;
        src0 = &local_138;
        break;
      case 0xf:
        length = 0x10;
        src0 = &local_48;
        break;
      case 0x10:
        local_138 = local_68;
        dStack_130 = dStack_60;
        local_128 = local_78;
        dStack_120 = dStack_70;
        length = 0x20;
        src0 = &local_138;
      }
      nk_memcopy(dst0,src0,length);
LAB_001227d5:
      fVar1 = pnVar4->x;
      pnVar4 = pnVar4 + 2;
    } while (fVar1 != 4.2039e-45);
  }
  return (void *)((long)dst + local_c0);
}

Assistant:

NK_INTERN void*
nk_draw_vertex(void *dst, const struct nk_convert_config *config,
    struct nk_vec2 pos, struct nk_vec2 uv, struct nk_colorf color)
{
    void *result = (void*)((char*)dst + config->vertex_size);
    const struct nk_draw_vertex_layout_element *elem_iter = config->vertex_layout;
    while (!nk_draw_vertex_layout_element_is_end_of_layout(elem_iter)) {
        void *address = (void*)((char*)dst + elem_iter->offset);
        switch (elem_iter->attribute) {
        case NK_VERTEX_ATTRIBUTE_COUNT:
        default: NK_ASSERT(0 && "wrong element attribute"); break;
        case NK_VERTEX_POSITION: nk_draw_vertex_element(address, &pos.x, 2, elem_iter->format); break;
        case NK_VERTEX_TEXCOORD: nk_draw_vertex_element(address, &uv.x, 2, elem_iter->format); break;
        case NK_VERTEX_COLOR: nk_draw_vertex_color(address, &color.r, elem_iter->format); break;
        }
        elem_iter++;
    }
    return result;
}